

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void IsolatePhiNodes(VmModule *module,VmFunction *function)

{
  VmValue *pVVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  VmInstruction *pVVar6;
  VmValue **ppVVar7;
  VmBlock *pVVar8;
  VmInstruction *pVVar9;
  VmInstruction **ppVVar10;
  bool bVar11;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmValue *in_stack_fffffffffffffda0;
  VmBlock *parentB;
  VmInstruction *copyB;
  uint k;
  bool replaced;
  VmBlock *curr;
  VmBlock *parentA;
  VmInstruction *copyA;
  uint i;
  VmInstruction *def;
  VmInstruction *def_1;
  VmBlock *edge;
  VmInstruction *instruction;
  uint local_11c;
  undefined1 local_118 [4];
  uint argument;
  SmallArray<VmInstruction_*,_16U> copyInstructions;
  VmBlock *edgeB;
  VmInstruction *instructionB;
  uint argumentB;
  VmBlock *edgeA;
  VmInstruction *instructionA;
  VmBlock *pVStack_50;
  uint argumentA;
  VmInstruction *inst;
  VmBlock *block_1;
  VmBlock *local_20;
  VmBlock *block;
  VmFunction *function_local;
  VmModule *module_local;
  
  for (local_20 = function->firstBlock; local_20 != (VmBlock *)0x0; local_20 = local_20->nextSibling
      ) {
    if (local_20->firstInstruction != (VmInstruction *)0x0) {
      module->currentBlock = local_20;
      local_20->insertPoint = local_20->lastInstruction->prevSibling;
      type.structType = (TypeBase *)0x51;
      type._0_8_ = VmType::Void.structType;
      pVVar6 = anon_unknown.dwarf_c91b1::CreateInstruction
                         ((anon_unknown_dwarf_c91b1 *)module,(VmModule *)0x0,
                          (SynBase *)VmType::Void._0_8_,type,VM_INST_LOAD_BYTE,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,in_stack_fffffffffffffda0);
      local_20->exitPc = pVVar6;
      local_20->insertPoint = local_20->firstInstruction;
      while( true ) {
        bVar11 = false;
        if (local_20->insertPoint != (VmInstruction *)0x0) {
          bVar11 = local_20->insertPoint->cmd == VM_INST_PHI;
        }
        if (!bVar11) break;
        local_20->insertPoint = local_20->insertPoint->nextSibling;
      }
      if (local_20->insertPoint == (VmInstruction *)0x0) {
        __assert_fail("block->insertPoint",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1aa2,"void IsolatePhiNodes(VmModule *, VmFunction *)");
      }
      local_20->insertPoint = local_20->insertPoint->prevSibling;
      type_00.structType = (TypeBase *)0x51;
      type_00._0_8_ = VmType::Void.structType;
      pVVar6 = anon_unknown.dwarf_c91b1::CreateInstruction
                         ((anon_unknown_dwarf_c91b1 *)module,(VmModule *)0x0,
                          (SynBase *)VmType::Void._0_8_,type_00,VM_INST_LOAD_BYTE,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,in_stack_fffffffffffffda0);
      local_20->entryPc = pVVar6;
      local_20->insertPoint = local_20->lastInstruction;
      module->currentBlock = (VmBlock *)0x0;
    }
  }
  inst = (VmInstruction *)function->firstBlock;
  do {
    if (inst == (VmInstruction *)0x0) {
      return;
    }
    for (pVStack_50 = (VmBlock *)(inst->arguments).little[3]; pVStack_50 != (VmBlock *)0x0;
        pVStack_50 = (VmBlock *)(pVStack_50->predecessors).data) {
      if (*(int *)&(pVStack_50->name).begin == 0x4d) {
        for (instructionA._4_4_ = 0;
            uVar4 = SmallArray<VmValue_*,_4U>::size
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end),
            instructionA._4_4_ < uVar4; instructionA._4_4_ = instructionA._4_4_ + 2) {
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,
                               instructionA._4_4_);
          pVVar6 = getType<VmInstruction>(*ppVVar7);
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,
                               instructionA._4_4_ + 1);
          pVVar8 = getType<VmBlock>(*ppVVar7);
          uVar4 = instructionA._4_4_;
          while( true ) {
            instructionB._4_4_ = uVar4 + 2;
            uVar5 = SmallArray<VmValue_*,_4U>::size
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end);
            if (uVar5 <= instructionB._4_4_) break;
            ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,
                                 instructionB._4_4_);
            pVVar9 = getType<VmInstruction>(*ppVVar7);
            ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,uVar4 + 3);
            copyInstructions.allocator = (Allocator *)getType<VmBlock>(*ppVVar7);
            uVar4 = instructionB._4_4_;
            if ((pVVar8 == (VmBlock *)copyInstructions.allocator) && (pVVar6 == pVVar9)) {
              __assert_fail("instructionA != instructionB",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1ac0,"void IsolatePhiNodes(VmModule *, VmFunction *)");
            }
          }
        }
        SmallArray<VmInstruction_*,_16U>::SmallArray
                  ((SmallArray<VmInstruction_*,_16U> *)local_118,module->allocator);
        for (local_11c = 0;
            uVar4 = SmallArray<VmValue_*,_4U>::size
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end),
            local_11c < uVar4; local_11c = local_11c + 2) {
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,local_11c);
          pVVar6 = getType<VmInstruction>(*ppVVar7);
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,local_11c + 1);
          pVVar8 = getType<VmBlock>(*ppVVar7);
          module->currentBlock = pVVar8;
          pVVar8->insertPoint = pVVar8->lastInstruction->prevSibling;
          pVVar8->insertPoint = pVVar8->exitPc->prevSibling;
          type_01.structType = (TypeBase *)0x50;
          type_01._0_8_ = (pVVar6->super_VmValue).type.structType;
          pVVar9 = anon_unknown.dwarf_c91b1::CreateInstruction
                             ((anon_unknown_dwarf_c91b1 *)module,(VmModule *)0x0,
                              *(SynBase **)&(pVVar6->super_VmValue).type,type_01,VM_INST_LOAD_BYTE,
                              (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_fffffffffffffda0
                             );
          pcVar2 = (pVVar6->super_VmValue).comment.end;
          (pVVar9->super_VmValue).comment.begin = (pVVar6->super_VmValue).comment.begin;
          (pVVar9->super_VmValue).comment.end = pcVar2;
          VmInstruction::AddArgument(pVVar8->exitPc,&pVVar9->super_VmValue);
          VmInstruction::AddArgument(pVVar8->exitPc,&pVVar6->super_VmValue);
          VmValue::AddUse(&pVVar9->super_VmValue,&pVStack_50->super_VmValue);
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,local_11c);
          VmValue::RemoveUse(*ppVVar7,&pVStack_50->super_VmValue);
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&(pVStack_50->name).end,local_11c);
          *ppVVar7 = &pVVar9->super_VmValue;
          pVVar8->insertPoint = pVVar8->lastInstruction;
          module->currentBlock = (VmBlock *)0x0;
        }
        module->currentBlock = (VmBlock *)inst;
        inst->parent = pVStack_50;
        while( true ) {
          bVar11 = false;
          if (inst->parent != (VmBlock *)0x0) {
            bVar11 = *(int *)&(inst->parent->name).begin == 0x4d;
          }
          if (!bVar11) break;
          inst->parent = (VmBlock *)(inst->parent->predecessors).data;
        }
        if (inst->parent == (VmBlock *)0x0) {
          __assert_fail("block->insertPoint",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1aee,"void IsolatePhiNodes(VmModule *, VmFunction *)");
        }
        inst->parent = *(VmBlock **)&inst->parent->address;
        inst->parent = (VmBlock *)(inst[1].idom)->prevSibling;
        type_02.structType = (TypeBase *)0x50;
        type_02._0_8_ = (pVStack_50->super_VmValue).type.structType;
        pVVar6 = anon_unknown.dwarf_c91b1::CreateInstruction
                           ((anon_unknown_dwarf_c91b1 *)module,
                            (VmModule *)(pVStack_50->super_VmValue).source,
                            *(SynBase **)&(pVStack_50->super_VmValue).type,type_02,VM_INST_LOAD_BYTE
                            ,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_fffffffffffffda0)
        ;
        pcVar2 = (pVStack_50->super_VmValue).comment.end;
        (pVVar6->super_VmValue).comment.begin = (pVStack_50->super_VmValue).comment.begin;
        (pVVar6->super_VmValue).comment.end = pcVar2;
        VmInstruction::AddArgument(inst[1].idom,&pVVar6->super_VmValue);
        (pVStack_50->super_VmValue).canBeRemoved = false;
        anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                  (module,&pVStack_50->super_VmValue,&pVVar6->super_VmValue,(uint *)0x0);
        VmInstruction::AddArgument(inst[1].idom,&pVStack_50->super_VmValue);
        (pVStack_50->super_VmValue).canBeRemoved = true;
        inst->parent = (VmBlock *)(inst->arguments).allocator;
        module->currentBlock = (VmBlock *)0x0;
        for (copyA._4_4_ = 0;
            uVar4 = SmallArray<VmInstruction_*,_16U>::size
                              ((SmallArray<VmInstruction_*,_16U> *)local_118), copyA._4_4_ < uVar4;
            copyA._4_4_ = copyA._4_4_ + 1) {
          ppVVar10 = SmallArray<VmInstruction_*,_16U>::operator[]
                               ((SmallArray<VmInstruction_*,_16U> *)local_118,copyA._4_4_);
          pVVar6 = *ppVVar10;
          for (_k = pVVar6->parent->idom; _k != (VmBlock *)0x0; _k = _k->idom) {
            bVar11 = false;
            for (copyB._0_4_ = 0;
                uVar4 = SmallArray<VmInstruction_*,_16U>::size
                                  ((SmallArray<VmInstruction_*,_16U> *)local_118),
                (uint)copyB < uVar4; copyB._0_4_ = (uint)copyB + 1) {
              if (copyA._4_4_ != (uint)copyB) {
                ppVVar10 = SmallArray<VmInstruction_*,_16U>::operator[]
                                     ((SmallArray<VmInstruction_*,_16U> *)local_118,(uint)copyB);
                pVVar9 = *ppVVar10;
                bVar3 = SmallArray<VmValue_*,_8U>::empty(&(pVVar9->super_VmValue).users);
                if (!bVar3) {
                  ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,0);
                  pVVar1 = *ppVVar7;
                  ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,0);
                  if ((pVVar1 == *ppVVar7) && (pVVar9->parent == _k)) {
                    anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                              (module,&pVVar6->super_VmValue,&pVVar9->super_VmValue,(uint *)0x0);
                    bVar11 = true;
                    break;
                  }
                }
              }
            }
            if (bVar11) break;
          }
        }
        SmallArray<VmInstruction_*,_16U>::~SmallArray((SmallArray<VmInstruction_*,_16U> *)local_118)
        ;
      }
    }
    inst = (VmInstruction *)(inst->arguments).little[2];
  } while( true );
}

Assistant:

void IsolatePhiNodes(VmModule *module, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		if(!block->firstInstruction)
			continue;

		// Insert empty parallel copy at the end of a block (before terminator)
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		block->exitPc = CreateInstruction(module, NULL, VmType::Void, VM_INST_PARALLEL_COPY, NULL, NULL, NULL, NULL);

		// Insert empty parallel copy at the start of a block (after phi instructions)
		block->insertPoint = block->firstInstruction;

		while(block->insertPoint && block->insertPoint->cmd == VM_INST_PHI)
			block->insertPoint = block->insertPoint->nextSibling;

		assert(block->insertPoint);

		block->insertPoint = block->insertPoint->prevSibling;

		block->entryPc = CreateInstruction(module, NULL, VmType::Void, VM_INST_PARALLEL_COPY, NULL, NULL, NULL, NULL);

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			// For each phi node
			if(inst->cmd == VM_INST_PHI)
			{
#if !defined(NDEBUG)
				// Avoid surprises, each edge might introduce only a single variable
				for(unsigned argumentA = 0; argumentA < inst->arguments.size(); argumentA += 2)
				{
					VmInstruction *instructionA = getType<VmInstruction>(inst->arguments[argumentA]);
					VmBlock *edgeA = getType<VmBlock>(inst->arguments[argumentA + 1]);

					for(unsigned argumentB = argumentA + 2; argumentB < inst->arguments.size(); argumentB += 2)
					{
						VmInstruction *instructionB = getType<VmInstruction>(inst->arguments[argumentB]);
						VmBlock *edgeB = getType<VmBlock>(inst->arguments[argumentB + 1]);

						if(edgeA == edgeB)
							assert(instructionA != instructionB);
					}
				}
#endif

				SmallArray<VmInstruction*, 16> copyInstructions(module->allocator);

				// Introduce a copy at the end of the predecessor block
				for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
				{
					VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);
					VmBlock *edge = getType<VmBlock>(inst->arguments[argument + 1]);

					// In a general case if instruction set contains instructions that modify the value after the branch, it won't be valid to insert a copy

					// Place copy before the terminator instruction
					module->currentBlock = edge;
					edge->insertPoint = edge->lastInstruction->prevSibling;

					edge->insertPoint = edge->exitPc->prevSibling;

					VmInstruction *def = CreateInstruction(module, NULL, instruction->type, VM_INST_DEF, NULL, NULL, NULL, NULL);

					def->comment = instruction->comment;

					edge->exitPc->AddArgument(def);
					edge->exitPc->AddArgument(instruction);

					def->AddUse(inst);
					inst->arguments[argument]->RemoveUse(inst);

					inst->arguments[argument] = def;

					edge->insertPoint = edge->lastInstruction;
					module->currentBlock = NULL;
				}

				// In general case if optimization passes create multiple incoming edges from a single block, it won't be valid to insert a copy

				// Introduce a copy right after the phi node
				module->currentBlock = block;
				block->insertPoint = inst;

				while(block->insertPoint && block->insertPoint->cmd == VM_INST_PHI)
					block->insertPoint = block->insertPoint->nextSibling;

				assert(block->insertPoint);

				block->insertPoint = block->insertPoint->prevSibling;

				block->insertPoint = block->entryPc->prevSibling;

				VmInstruction *def = CreateInstruction(module, inst->source, inst->type, VM_INST_DEF, NULL, NULL, NULL, NULL);

				def->comment = inst->comment;

				block->entryPc->AddArgument(def);

				inst->canBeRemoved = false;

				ReplaceValueUsersWith(module, inst, def, NULL);

				block->entryPc->AddArgument(inst);

				inst->canBeRemoved = true;

				block->insertPoint = block->lastInstruction;
				module->currentBlock = NULL;

				// Remove redundant copies
				for(unsigned i = 0; i < copyInstructions.size(); i++)
				{
					VmInstruction *copyA = copyInstructions[i];
					VmBlock *parentA = copyA->parent;

					for(VmBlock *curr = parentA->idom; curr; curr = curr->idom)
					{
						bool replaced = false;

						for(unsigned k = 0; k < copyInstructions.size(); k++)
						{
							if(i == k)
								continue;

							VmInstruction *copyB = copyInstructions[k];

							// Check if already dead
							if(copyB->users.empty())
								continue;

							// Check if the copy is the same
							if(copyA->arguments[0] != copyB->arguments[0])
								continue;

							VmBlock *parentB = copyB->parent;

							// If immediate dominator contains the same copy, use it
							if(parentB == curr)
							{
								ReplaceValueUsersWith(module, copyA, copyB, NULL);
								replaced = true;
								break;
							}
						}

						if(replaced)
							break;
					}
				}
			}
		}
	}
}